

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O3

int obudec_read_obu_header_and_size
              (AvxInputContext *input_ctx,size_t buffer_capacity,int is_annexb,uint8_t *buffer,
              size_t *bytes_read,size_t *payload_length,ObuHeader *obu_header,_Bool buffered)

{
  int iVar1;
  uint8_t *obu_data;
  undefined1 auVar2 [16];
  uint64_t obu_size;
  size_t leb128_length_payload;
  uint64_t u64_payload_length;
  size_t local_60;
  size_t local_58;
  undefined8 local_50;
  size_t local_48;
  size_t *local_40;
  uint64_t local_38;
  
  auVar2._0_4_ = -(uint)(buffer == (uint8_t *)0x0);
  auVar2._4_4_ = -(uint)(bytes_read == (size_t *)0x0);
  auVar2._8_4_ = -(uint)(payload_length == (size_t *)0x0);
  auVar2._12_4_ = -(uint)(obu_header == (ObuHeader *)0x0);
  iVar1 = movmskps((int)buffer,auVar2);
  if (iVar1 != 0 || buffer_capacity < 0x12) {
    return -1;
  }
  local_60 = 0;
  local_48 = 0;
  local_50 = 0;
  local_40 = bytes_read;
  if (is_annexb == 0) {
    is_annexb = 0;
    obu_data = buffer;
LAB_005bae76:
    local_58 = 0;
    iVar1 = obudec_read_obu_header
                      (input_ctx,buffer_capacity,is_annexb,obu_data,obu_header,&local_58,buffered);
    if (iVar1 != 0) {
      return -1;
    }
    if (local_58 == 0) {
LAB_005baee8:
      *payload_length = 0;
    }
    else {
      if (obu_header->has_size_field == 0) {
        if (local_50 < local_58) {
          obudec_read_obu_header_and_size_cold_5();
          return -1;
        }
        *payload_length = local_50 - local_58;
        local_48 = 0;
      }
      else {
        local_38 = 0;
        iVar1 = obudec_read_leb128(input_ctx,buffer + local_58 + local_60,&local_48,&local_38,
                                   buffered);
        if (iVar1 != 0) {
          obudec_read_obu_header_and_size_cold_3();
          return -1;
        }
        if (local_38 >> 0x20 != 0) {
          obudec_read_obu_header_and_size_cold_4();
          return -1;
        }
        *payload_length = local_38;
      }
      *local_40 = local_58 + local_60 + local_48;
    }
    iVar1 = 0;
  }
  else {
    iVar1 = obudec_read_leb128(input_ctx,buffer,&local_60,&local_50,buffered);
    if (iVar1 == 0) {
      if (local_60 == 0) goto LAB_005baee8;
      if (local_50._4_4_ == 0) {
        buffer_capacity = buffer_capacity - local_60;
        obu_data = buffer + local_60;
        goto LAB_005bae76;
      }
      obudec_read_obu_header_and_size_cold_2();
    }
    else {
      obudec_read_obu_header_and_size_cold_1();
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int obudec_read_obu_header_and_size(
    struct AvxInputContext *input_ctx, size_t buffer_capacity, int is_annexb,
    uint8_t *buffer, size_t *bytes_read, size_t *payload_length,
    ObuHeader *obu_header, bool buffered) {
  const size_t kMinimumBufferSize = OBU_MAX_HEADER_SIZE;
  if (!input_ctx || !buffer || !bytes_read || !payload_length || !obu_header ||
      buffer_capacity < kMinimumBufferSize) {
    return -1;
  }

  size_t leb128_length_obu = 0;
  size_t leb128_length_payload = 0;
  uint64_t obu_size = 0;
  if (is_annexb) {
    if (obudec_read_leb128(input_ctx, &buffer[0], &leb128_length_obu, &obu_size,
                           buffered) != 0) {
      fprintf(stderr, "obudec: Failure reading OBU size length.\n");
      return -1;
    } else if (leb128_length_obu == 0) {
      *payload_length = 0;
      return 0;
    }
    if (obu_size > UINT32_MAX) {
      fprintf(stderr, "obudec: OBU payload length too large.\n");
      return -1;
    }
  }

  size_t header_size = 0;
  if (obudec_read_obu_header(input_ctx, buffer_capacity - leb128_length_obu,
                             is_annexb, buffer + leb128_length_obu, obu_header,
                             &header_size, buffered) != 0) {
    return -1;
  } else if (header_size == 0) {
    *payload_length = 0;
    return 0;
  }

  if (!obu_header->has_size_field) {
    assert(is_annexb);
    if (obu_size < header_size) {
      fprintf(stderr, "obudec: OBU size is too small.\n");
      return -1;
    }
    *payload_length = (size_t)obu_size - header_size;
  } else {
    uint64_t u64_payload_length = 0;
    if (obudec_read_leb128(input_ctx, &buffer[leb128_length_obu + header_size],
                           &leb128_length_payload, &u64_payload_length,
                           buffered) != 0) {
      fprintf(stderr, "obudec: Failure reading OBU payload length.\n");
      return -1;
    }
    if (u64_payload_length > UINT32_MAX) {
      fprintf(stderr, "obudec: OBU payload length too large.\n");
      return -1;
    }

    *payload_length = (size_t)u64_payload_length;
  }

  *bytes_read = leb128_length_obu + header_size + leb128_length_payload;
  return 0;
}